

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateCopyConstructorCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *pcVar2;
  Formatter format;
  Formatter local_50;
  
  local_50.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_50.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  (*(this->super_FieldGenerator)._vptr_FieldGenerator[0xf])(this,printer);
  bVar1 = HasHasbit((this->super_FieldGenerator).descriptor_);
  pcVar2 = "if (!from._internal_$name$().empty()) {\n";
  if (bVar1) {
    pcVar2 = "if (from._internal_has_$name$()) {\n";
  }
  Formatter::operator()<>(&local_50,pcVar2);
  io::Printer::Indent(local_50.printer_);
  pcVar2 = 
  "$name$_.Set($default_value_tag$, from._internal_$name$(), \n  GetArenaForAllocation());\n";
  if (this->inlined_ != false) {
    pcVar2 = 
    "$name$_.Set(nullptr, from._internal_$name$(),\n  GetArenaForAllocation(), _internal_$name$_donated(), &$donating_states_word$, $mask_for_undonate$);\n"
    ;
  }
  Formatter::operator()<>(&local_50,pcVar2);
  io::Printer::Outdent(local_50.printer_);
  Formatter::operator()<>(&local_50,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50.vars_._M_t);
  return;
}

Assistant:

void StringFieldGenerator::GenerateCopyConstructorCode(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  GenerateConstructorCode(printer);

  if (HasHasbit(descriptor_)) {
    format("if (from._internal_has_$name$()) {\n");
  } else {
    format("if (!from._internal_$name$().empty()) {\n");
  }

  format.Indent();

  if (!inlined_) {
    format(
        "$name$_.Set($default_value_tag$, from._internal_$name$(), \n"
        "  GetArenaForAllocation());\n");
  } else {
    format(
        "$name$_.Set(nullptr, from._internal_$name$(),\n"
        "  GetArenaForAllocation(), _internal_$name$_donated(), "
        "&$donating_states_word$, $mask_for_undonate$);\n");
  }

  format.Outdent();
  format("}\n");
}